

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

TestGroup * __thiscall xe::TestGroup::createGroup(TestGroup *this,char *name,char *description)

{
  TestGroup *this_00;
  _Rb_tree_header *p_Var1;
  
  this_00 = (TestGroup *)operator_new(0xa0);
  TestNode::TestNode((TestNode *)this_00,this,TESTNODETYPE_GROUP,name,description);
  (this_00->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestGroup_0014f908;
  (this_00->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header;
  (this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this_00->m_childNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return this_00;
}

Assistant:

TestGroup* TestGroup::createGroup (const char* name, const char* description)
{
	return new TestGroup(this, TESTNODETYPE_GROUP, name, description);
}